

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O2

Namer * __thiscall
LiteScript::Namer::Load
          (Namer *__return_storage_ptr__,Namer *this,istream *stream,Memory *memory,
          offset_in_Memory_to_subr caller)

{
  uint uVar1;
  uint id;
  Memory *pMVar2;
  istream *piVar3;
  bool bVar4;
  Variable local_60;
  Nullable<LiteScript::Variable> local_50;
  
  piVar3 = stream + caller;
  pMVar2 = memory;
  if (((ulong)memory & 1) != 0) {
    pMVar2 = *(Memory **)((long)(memory->arr)._M_elems + *(long *)piVar3 + -1);
  }
  uVar1 = (*(code *)pMVar2)(piVar3,this);
  Memory::GetVariable(&local_50,(Memory *)stream,uVar1);
  Variable::Variable(&local_60,(Variable *)&local_50);
  Namer(__return_storage_ptr__,&local_60);
  Variable::~Variable(&local_60);
  Nullable<LiteScript::Variable>::Nullify(&local_50);
  pMVar2 = memory;
  if (((ulong)memory & 1) != 0) {
    pMVar2 = *(Memory **)((long)(memory->arr)._M_elems + *(long *)piVar3 + -1);
  }
  uVar1 = (*(code *)pMVar2)(piVar3,this);
  Memory::GetVariable(&local_50,(Memory *)stream,uVar1);
  Nullable<LiteScript::Variable>::operator=(&__return_storage_ptr__->current,&local_50);
  Nullable<LiteScript::Variable>::Nullify(&local_50);
  uVar1 = IStreamer::Read<unsigned_int>((istream *)this);
  while (bVar4 = uVar1 != 0, uVar1 = uVar1 - 1, bVar4) {
    pMVar2 = memory;
    if (((ulong)memory & 1) != 0) {
      pMVar2 = *(Memory **)((long)(memory->arr)._M_elems + *(long *)piVar3 + -1);
    }
    id = (*(code *)pMVar2)(piVar3,this);
    Memory::GetVariable(&local_50,(Memory *)stream,id);
    Variable::Variable(&local_60,(Variable *)&local_50);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
    emplace_back<LiteScript::Variable>(&__return_storage_ptr__->heap,&local_60);
    Variable::~Variable(&local_60);
    Nullable<LiteScript::Variable>::Nullify(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

LiteScript::Namer LiteScript::Namer::Load(std::istream &stream, Memory& memory, unsigned int (Memory::*caller)(std::istream&)) {
    Namer res(memory.GetVariable((memory.*caller)(stream)));
    res.current = memory.GetVariable((memory.*caller)(stream));
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        res.heap.push_back(memory.GetVariable((memory.*caller)(stream)));
    return res;
}